

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_SetConstructor2(JSContext *ctx,JSValue func_obj,JSValue proto,int proto_flags,int ctor_flags
                       )

{
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v;
  JSValue obj;
  JSValue val;
  JSValue v_00;
  JSValue val_00;
  JSValue obj_00;
  JSValueUnion in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSContext *in_R8;
  undefined8 unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000020;
  undefined4 local_20;
  JSAtom prop;
  
  local_20 = in_RCX.int32;
  prop = in_RCX._4_4_;
  v.tag = (int64_t)in_R8;
  v.u.float64 = in_RCX.float64;
  JS_DupValue(in_RDI,v);
  this_obj.tag._0_4_ = in_stack_00000008;
  this_obj.u.ptr = (void *)unaff_retaddr;
  this_obj.tag._4_4_ = in_stack_0000000c;
  val.tag = in_RDX;
  val.u.ptr = in_RSI.ptr;
  JS_DefinePropertyValue(in_R8,this_obj,prop,val,in_stack_00000020);
  v_00.tag = in_RDX;
  v_00.u.ptr = in_RSI.ptr;
  JS_DupValue(in_RDI,v_00);
  this_obj_00.tag._0_4_ = in_stack_00000008;
  this_obj_00.u.ptr = (void *)unaff_retaddr;
  this_obj_00.tag._4_4_ = in_stack_0000000c;
  val_00.tag = in_RDX;
  val_00.u.ptr = in_RSI.ptr;
  JS_DefinePropertyValue(in_R8,this_obj_00,prop,val_00,in_stack_00000020);
  obj_00.tag = in_RDX;
  obj_00.u.ptr = in_RSI.ptr;
  set_cycle_flag(in_RDI,obj_00);
  obj.u._4_4_ = prop;
  obj.u.int32 = local_20;
  obj.tag = (int64_t)in_R8;
  set_cycle_flag(in_RDI,obj);
  return;
}

Assistant:

static void JS_SetConstructor2(JSContext *ctx,
                               JSValueConst func_obj,
                               JSValueConst proto,
                               int proto_flags, int ctor_flags)
{
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_prototype,
                           JS_DupValue(ctx, proto), proto_flags);
    JS_DefinePropertyValue(ctx, proto, JS_ATOM_constructor,
                           JS_DupValue(ctx, func_obj),
                           ctor_flags);
    set_cycle_flag(ctx, func_obj);
    set_cycle_flag(ctx, proto);
}